

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

void Abc_CutFactor_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  while( true ) {
    if ((*(uint *)&pObj->field_0x14 & 0x10) != 0) {
      return;
    }
    uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar1 == 2) || (uVar1 == 5)) ||
       ((1 < (pObj->vFanouts).nSize && (iVar2 = Abc_NodeIsMuxControlType(pObj), iVar2 == 0))))
    break;
    Abc_CutFactor_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  }
  uVar1 = vLeaves->nCap;
  if (vLeaves->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vLeaves->pArray,0x80);
      }
      vLeaves->pArray = ppvVar3;
      iVar2 = 0x10;
    }
    else {
      iVar2 = uVar1 * 2;
      if (iVar2 <= (int)uVar1) goto LAB_00302bea;
      if (vLeaves->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
      }
      vLeaves->pArray = ppvVar3;
    }
    vLeaves->nCap = iVar2;
  }
LAB_00302bea:
  iVar2 = vLeaves->nSize;
  vLeaves->nSize = iVar2 + 1;
  vLeaves->pArray[iVar2] = pObj;
  pObj->field_0x14 = pObj->field_0x14 | 0x10;
  return;
}

Assistant:

void Abc_CutFactor_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves )
{
    if ( pObj->fMarkA )
        return;
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkA = 1;
        return;
    }
    Abc_CutFactor_rec( Abc_ObjFanin0(pObj), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pObj), vLeaves );
}